

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O0

duckdb_logical_type duckdb_array_type_child_type(duckdb_logical_type type)

{
  bool bVar1;
  LogicalTypeId LVar2;
  LogicalType *this;
  LogicalType *in_RDI;
  LogicalType *logical_type;
  LogicalType *in_stack_ffffffffffffffd0;
  duckdb_logical_type in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  bVar1 = AssertLogicalTypeId(in_stack_ffffffffffffffd8,
                              (LogicalTypeId)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
  if (bVar1) {
    LVar2 = duckdb::LogicalType::id(in_RDI);
    if (LVar2 == ARRAY) {
      local_8 = (LogicalType *)operator_new(0x18);
      this = duckdb::ArrayType::GetChildType(in_stack_ffffffffffffffd0);
      duckdb::LogicalType::LogicalType(this,local_8);
    }
    else {
      local_8 = (LogicalType *)0x0;
    }
  }
  else {
    local_8 = (LogicalType *)0x0;
  }
  return (duckdb_logical_type)local_8;
}

Assistant:

duckdb_logical_type duckdb_array_type_child_type(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::ARRAY)) {
		return nullptr;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != duckdb::LogicalTypeId::ARRAY) {
		return nullptr;
	}
	return reinterpret_cast<duckdb_logical_type>(
	    new duckdb::LogicalType(duckdb::ArrayType::GetChildType(logical_type)));
}